

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kvtree.c
# Opt level: O0

int kvtree_unset_kv(kvtree *hash,char *key,char *val)

{
  int iVar1;
  kvtree *hash_00;
  undefined4 local_34;
  int rc;
  kvtree *v;
  char *val_local;
  char *key_local;
  kvtree *hash_local;
  
  if (hash == (kvtree *)0x0) {
    hash_local._4_4_ = 0;
  }
  else {
    hash_00 = kvtree_get(hash,key);
    local_34 = kvtree_unset(hash_00,val);
    iVar1 = kvtree_size(hash_00);
    if (iVar1 == 0) {
      local_34 = kvtree_unset(hash,key);
    }
    hash_local._4_4_ = local_34;
  }
  return hash_local._4_4_;
}

Assistant:

int kvtree_unset_kv(kvtree* hash, const char* key, const char* val)
{
  if (hash == NULL) {
    return KVTREE_SUCCESS;
  }

  kvtree* v = kvtree_get(hash, key);
  int rc = kvtree_unset(v, val);
  if (kvtree_size(v) == 0) {
    rc = kvtree_unset(hash, key);
  }

  return rc;
}